

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

idx_t duckdb_array_type_array_size(duckdb_logical_type type)

{
  ExtraTypeInfo *pEVar1;
  optional_ptr<duckdb::ExtraTypeInfo,_true> oStack_8;
  
  if ((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x6c)) {
    oStack_8.ptr = *(ExtraTypeInfo **)(type + 8);
    pEVar1 = duckdb::optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&oStack_8);
    return (ulong)(uint)pEVar1[1].alias._M_string_length;
  }
  return 0;
}

Assistant:

static bool AssertLogicalTypeId(duckdb_logical_type type, duckdb::LogicalTypeId type_id) {
	if (!type) {
		return false;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != type_id) {
		return false;
	}
	return true;
}